

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O2

EColorRange ParseOptionColor(FScanner *sc,FOptionMenuDescriptor *desc)

{
  bool bVar1;
  EColorRange EVar2;
  long lVar3;
  FName local_1c;
  
  EVar2 = OptionSettings.mFontColor;
  bVar1 = FScanner::CheckString(sc,",");
  if (bVar1) {
    FScanner::MustGetString(sc);
    FName::FName(&local_1c,sc->String);
    EVar2 = V_FindFontColor(&local_1c);
    if (EVar2 == CR_UNTRANSLATED) {
      bVar1 = FScanner::Compare(sc,"untranslated");
      EVar2 = CR_UNTRANSLATED;
      if (((!bVar1) && ((int)*sc->String - 0x30U < 10)) &&
         (lVar3 = strtol(sc->String,(char **)0x0,0), EVar2 = OptionSettings.mFontColorHeader,
         lVar3 == 0)) {
        EVar2 = CR_UNTRANSLATED;
      }
    }
  }
  return EVar2;
}

Assistant:

static EColorRange ParseOptionColor(FScanner &sc, FOptionMenuDescriptor *desc)
{
	EColorRange cr = OptionSettings.mFontColor;
	if (sc.CheckString(","))
	{
		sc.MustGetString();
		cr = V_FindFontColor(sc.String);
		if (cr == CR_UNTRANSLATED && !sc.Compare("untranslated") && isdigit(sc.String[0]))
		{
			if (strtol(sc.String, NULL, 0)) cr = OptionSettings.mFontColorHeader;
		}
	}
	return cr;
}